

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  CFF_Font pCVar1;
  CFF_VarData *pCVar2;
  CFF_VarRegion *pCVar3;
  CFF_AxisCoords *pCVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  FT_Int32 *pFVar10;
  long b_;
  FT_Long FVar11;
  FT_Fixed *__dest;
  int iVar12;
  FT_Error FVar13;
  ulong uVar14;
  long a_;
  uint uVar15;
  long *plVar16;
  long lVar17;
  size_t __n;
  FT_Error error;
  FT_Error local_68;
  FT_UInt local_64;
  ulong local_60;
  FT_Memory local_58;
  long *local_50;
  ulong local_48;
  CFF_VarData *local_40;
  CFF_Font local_38;
  
  local_68 = 0;
  pCVar1 = blend->font;
  local_58 = pCVar1->memory;
  blend->builtBV = '\0';
  if ((lenNDV == 0) || (FVar13 = 3, (pCVar1->vstore).axisCount == lenNDV)) {
    if (vsindex < (pCVar1->vstore).dataCount) {
      pCVar2 = (pCVar1->vstore).varData;
      uVar15 = pCVar2[vsindex].regionIdxCount + 1;
      local_64 = vsindex;
      local_50 = NDV;
      pFVar10 = (FT_Int32 *)
                ft_mem_realloc(local_58,1,(ulong)blend->lenBV << 2,(ulong)uVar15 * 4,blend->BV,
                               &local_68);
      blend->BV = pFVar10;
      FVar13 = local_68;
      if (local_68 == 0) {
        blend->lenBV = uVar15;
        local_60 = (ulong)lenNDV;
        if (uVar15 != 0) {
          local_40 = pCVar2 + vsindex;
          lVar9 = local_60 * 0x18;
          uVar14 = 0;
          local_48 = (ulong)uVar15;
          local_38 = pCVar1;
          do {
            if (uVar14 == 0) {
              *pFVar10 = 0x10000;
            }
            else {
              uVar15 = local_40->regionIndices[uVar14 - 1];
              if ((local_38->vstore).regionCount <= uVar15) goto LAB_001406d1;
              if (lenNDV == 0) {
                pFVar10[uVar14] = 0;
              }
              else {
                pCVar3 = (local_38->vstore).varRegionList;
                pFVar10[uVar14] = 0x10000;
                lVar17 = 0;
                plVar16 = local_50;
                do {
                  pCVar4 = pCVar3[uVar15].axisList;
                  lVar5 = *(long *)((long)&pCVar4->startCoord + lVar17);
                  lVar6 = *(long *)((long)&pCVar4->peakCoord + lVar17);
                  iVar12 = 0x10000;
                  if (lVar5 <= lVar6) {
                    lVar7 = *(long *)((long)&pCVar4->endCoord + lVar17);
                    b_ = lVar7 - lVar6;
                    if (lVar6 <= lVar7) {
                      if ((lVar6 != 0) && (-1 < lVar5 || lVar7 < 1)) {
                        lVar8 = *plVar16;
                        a_ = lVar7 - lVar8;
                        if (lVar7 < lVar8 || lVar8 < lVar5) {
                          iVar12 = 0;
                        }
                        else if (lVar8 != lVar6) {
                          if (lVar8 < lVar6) {
                            b_ = lVar6 - lVar5;
                            a_ = lVar8 - lVar5;
                          }
                          FVar11 = FT_DivFix(a_,b_);
                          iVar12 = (int)FVar11;
                        }
                      }
                    }
                  }
                  pFVar10 = blend->BV;
                  pFVar10[uVar14] =
                       (FT_Int32)
                       ((ulong)((long)iVar12 * (long)pFVar10[uVar14] +
                                ((long)iVar12 * (long)pFVar10[uVar14] >> 0x3f) + 0x8000) >> 0x10);
                  lVar17 = lVar17 + 0x18;
                  plVar16 = plVar16 + 1;
                } while (lVar9 != lVar17);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_48);
        }
        blend->lastVsindex = local_64;
        if (lenNDV != 0) {
          __n = local_60 << 3;
          __dest = (FT_Fixed *)
                   ft_mem_realloc(local_58,1,(ulong)blend->lenNDV << 3,__n,blend->lastNDV,&local_68)
          ;
          blend->lastNDV = __dest;
          if (local_68 != 0) {
            return local_68;
          }
          memcpy(__dest,local_50,__n);
        }
        blend->lenNDV = lenNDV;
        blend->builtBV = '\x01';
        FVar13 = local_68;
      }
    }
    else {
LAB_001406d1:
      FVar13 = 3;
    }
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    FT_ASSERT( lenNDV == 0 || NDV );

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_REALLOC( blend->BV,
                     blend->lenBV * sizeof( *blend->BV ),
                     len * sizeof( *blend->BV ) ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n"
                    "   [ %f ",
                    len,
                    blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_REALLOC( blend->lastNDV,
                       blend->lenNDV * sizeof ( *NDV ),
                       lenNDV * sizeof ( *NDV ) ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }